

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-bset.c
# Opt level: O0

_Bool Curl_uint_bset_next(uint_bset *bset,uint last,uint *pnext)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  curl_uint64_t x;
  uint islot;
  uint *pnext_local;
  uint last_local;
  uint_bset *bset_local;
  
  uVar2 = last + 1;
  x._4_4_ = uVar2 >> 6;
  if (x._4_4_ < bset->nslots) {
    uVar3 = bset->slots[x._4_4_] >> ((byte)uVar2 & 0x3f);
    if (uVar3 == 0) {
      do {
        x._4_4_ = x._4_4_ + 1;
        if (bset->nslots <= x._4_4_) goto LAB_0019a0fb;
      } while (bset->slots[x._4_4_] == 0);
      iVar1 = 0;
      for (uVar3 = bset->slots[x._4_4_]; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x8000000000000000)
      {
        iVar1 = iVar1 + 1;
      }
      *pnext = x._4_4_ * 0x40 + iVar1;
      bset_local._7_1_ = true;
    }
    else {
      iVar1 = 0;
      for (; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x8000000000000000) {
        iVar1 = iVar1 + 1;
      }
      *pnext = uVar2 + iVar1;
      bset_local._7_1_ = true;
    }
  }
  else {
LAB_0019a0fb:
    *pnext = 0xffffffff;
    bset_local._7_1_ = false;
  }
  return bset_local._7_1_;
}

Assistant:

bool Curl_uint_bset_next(struct uint_bset *bset, unsigned int last,
                         unsigned int *pnext)
{
  unsigned int islot;
  curl_uint64_t x;

  ++last; /* look for number one higher than last */
  islot = last / 64; /* the slot this would be in */
  if(islot < bset->nslots) {
    /* shift away the bits we already iterated in this slot */
    x = (bset->slots[islot] >> (last % 64));
    if(x) {
      /* more bits set, next is `last` + trailing0s of the shifted slot */
      *pnext = last + CURL_CTZ64(x);
      return TRUE;
    }
    /* no more bits set in the last slot, scan forward */
    for(islot = islot + 1; islot < bset->nslots; ++islot) {
      if(bset->slots[islot]) {
        *pnext = (islot * 64) + CURL_CTZ64(bset->slots[islot]);
        return TRUE;
      }
    }
  }
  *pnext = UINT_MAX; /* a value we cannot store */
  return FALSE;
}